

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::writeFragmentPackets
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               FragmentPacket *fragmentPackets,int numRasterizedPackets,FaceType facetype,
               vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *fragmentOutputArray,
               float *depthValues,
               vector<rr::Fragment,_std::allocator<rr::Fragment>_> *fragmentBuffer)

{
  ulong uVar1;
  FragmentPacket *a;
  bool bVar2;
  int numSamples_00;
  int iVar3;
  vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_> *this;
  deUint64 dVar4;
  reference pvVar5;
  const_reference value;
  MultisamplePixelBufferAccess *msColorBuffer;
  MultisamplePixelBufferAccess *msDepthBuffer;
  MultisamplePixelBufferAccess *msStencilBuffer;
  size_type __n;
  FragmentOperationState *local_2278;
  float *local_2270;
  Fragment *fragment_1;
  int yo_1;
  int xo_1;
  FragmentPacket *packet_1;
  int fragNdx_1;
  int packetNdx_1;
  FragmentOperationState *fragOpsState;
  size_t outputNdx;
  undefined1 local_2218 [4];
  int fragCount_1;
  FragmentOperationState noStencilDepthWriteState;
  undefined8 local_2170;
  reference local_2168;
  Fragment *fragment;
  int yo;
  int xo;
  FragmentPacket *packet;
  int local_2148;
  int fragNdx;
  int packetNdx;
  int fragCount;
  FragmentProcessor fragProcessor;
  size_t numOutputs;
  int numSamples;
  FaceType facetype_local;
  int numRasterizedPackets_local;
  FragmentPacket *fragmentPackets_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  numSamples_00 = RenderTarget::getNumSamples(renderTarget);
  this = FragmentShader::getOutputs(program->fragmentShader);
  fragProcessor.m_sampleRegister[0x3f].unsignedValue.m_data._8_8_ =
       std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size(this);
  FragmentProcessor::FragmentProcessor((FragmentProcessor *)&packetNdx);
  fragNdx = 0;
  for (local_2148 = 0; local_2148 < numRasterizedPackets; local_2148 = local_2148 + 1) {
    for (packet._4_4_ = 0; packet._4_4_ < 4; packet._4_4_ = packet._4_4_ + 1) {
      _yo = fragmentPackets + local_2148;
      fragment._4_4_ = packet._4_4_ % 2;
      fragment._0_4_ = packet._4_4_ / 2;
      bVar2 = getCoverageAnyFragmentSampleLive
                        (_yo->coverage,numSamples_00,fragment._4_4_,(int)fragment);
      if (bVar2) {
        __n = (size_type)fragNdx;
        fragNdx = fragNdx + 1;
        local_2168 = std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::operator[]
                               (fragmentBuffer,__n);
        a = _yo;
        tcu::Vector<int,_2>::Vector
                  ((Vector<int,_2> *)&noStencilDepthWriteState.colorMask,fragment._4_4_,
                   (int)fragment);
        tcu::operator+((tcu *)&local_2170,&a->position,
                       (Vector<int,_2> *)&noStencilDepthWriteState.colorMask);
        *(undefined8 *)(local_2168->pixelCoord).m_data = local_2170;
        uVar1 = _yo->coverage;
        dVar4 = getCoverageFragmentSampleBits(numSamples_00,fragment._4_4_,(int)fragment);
        iVar3 = getCoverageOffset(numSamples_00,fragment._4_4_,(int)fragment);
        local_2168->coverage = (deUint32)((uVar1 & dVar4) >> ((byte)iVar3 & 0x3f));
        if (depthValues == (float *)0x0) {
          local_2270 = (float *)0x0;
        }
        else {
          local_2270 = depthValues +
                       (local_2148 * 4 + (int)fragment * 2 + fragment._4_4_) * numSamples_00;
        }
        local_2168->sampleDepths = local_2270;
      }
    }
  }
  FragmentOperationState::FragmentOperationState
            ((FragmentOperationState *)local_2218,&state->fragOps);
  noStencilDepthWriteState.depthTestEnabled = false;
  noStencilDepthWriteState.stencilStates[facetype].ref = 0;
  noStencilDepthWriteState.stencilStates[facetype].compMask = 0;
  noStencilDepthWriteState.stencilStates[facetype].sFail = STENCILOP_KEEP;
  outputNdx._4_4_ = 0;
  for (fragOpsState = (FragmentOperationState *)0x0;
      fragOpsState < (ulong)fragProcessor.m_sampleRegister[0x3f].unsignedValue.m_data._8_8_;
      fragOpsState = (FragmentOperationState *)&fragOpsState->field_0x1) {
    if (fragOpsState ==
        (FragmentOperationState *)
        (fragProcessor.m_sampleRegister[0x3f].unsignedValue.m_data._8_8_ + -1)) {
      local_2278 = &state->fragOps;
    }
    else {
      local_2278 = (FragmentOperationState *)local_2218;
    }
    for (packet_1._4_4_ = 0; packet_1._4_4_ < numRasterizedPackets;
        packet_1._4_4_ = packet_1._4_4_ + 1) {
      for (packet_1._0_4_ = 0; (int)packet_1 < 4; packet_1._0_4_ = (int)packet_1 + 1) {
        bVar2 = getCoverageAnyFragmentSampleLive
                          (fragmentPackets[packet_1._4_4_].coverage,numSamples_00,(int)packet_1 % 2,
                           (int)packet_1 / 2);
        if (bVar2) {
          pvVar5 = std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::operator[]
                             (fragmentBuffer,(long)outputNdx._4_4_);
          value = std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::operator[]
                            (fragmentOutputArray,
                             (long)fragOpsState->stencilStates +
                             (long)(packet_1._4_4_ * 4 + (int)packet_1) *
                             fragProcessor.m_sampleRegister[0x3f].unsignedValue.m_data._8_8_ + -0x18
                            );
          GenericVec4::operator=(&pvVar5->value,value);
          outputNdx._4_4_ = outputNdx._4_4_ + 1;
        }
      }
    }
    msColorBuffer = RenderTarget::getColorBuffer(renderTarget,(int)fragOpsState);
    msDepthBuffer = RenderTarget::getDepthBuffer(renderTarget);
    msStencilBuffer = RenderTarget::getStencilBuffer(renderTarget);
    pvVar5 = std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::operator[](fragmentBuffer,0);
    FragmentProcessor::render
              ((FragmentProcessor *)&packetNdx,msColorBuffer,msDepthBuffer,msStencilBuffer,pvVar5,
               outputNdx._4_4_,facetype,local_2278);
  }
  return;
}

Assistant:

void writeFragmentPackets (const RenderState&					state,
						   const RenderTarget&					renderTarget,
						   const Program&						program,
						   const FragmentPacket*				fragmentPackets,
						   int									numRasterizedPackets,
						   rr::FaceType							facetype,
						   const std::vector<rr::GenericVec4>&	fragmentOutputArray,
						   const float*							depthValues,
						   std::vector<Fragment>&				fragmentBuffer)
{
	const int			numSamples		= renderTarget.getNumSamples();
	const size_t		numOutputs		= program.fragmentShader->getOutputs().size();
	FragmentProcessor	fragProcessor;

	DE_ASSERT(fragmentOutputArray.size() >= (size_t)numRasterizedPackets*4*numOutputs);
	DE_ASSERT(fragmentBuffer.size()      >= (size_t)numRasterizedPackets*4);

	// Translate fragments but do not set the value yet
	{
		int	fragCount = 0;
		for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			const FragmentPacket&	packet	= fragmentPackets[packetNdx];
			const int				xo		= fragNdx%2;
			const int				yo		= fragNdx/2;

			if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
			{
				Fragment& fragment		= fragmentBuffer[fragCount++];

				fragment.pixelCoord		= packet.position + tcu::IVec2(xo, yo);
				fragment.coverage		= (deUint32)((packet.coverage & getCoverageFragmentSampleBits(numSamples, xo, yo)) >> getCoverageOffset(numSamples, xo, yo));
				fragment.sampleDepths	= (depthValues) ? (&depthValues[(packetNdx*4 + yo*2 + xo)*numSamples]) : (DE_NULL);
			}
		}
	}

	// Set per output output values
	{
		rr::FragmentOperationState noStencilDepthWriteState(state.fragOps);
		noStencilDepthWriteState.depthMask						= false;
		noStencilDepthWriteState.stencilStates[facetype].sFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpFail	= STENCILOP_KEEP;
		noStencilDepthWriteState.stencilStates[facetype].dpPass	= STENCILOP_KEEP;

		int	fragCount = 0;
		for (size_t outputNdx = 0; outputNdx < numOutputs; ++outputNdx)
		{
			// Only the last output-pass has default state, other passes have stencil & depth writemask=0
			const rr::FragmentOperationState& fragOpsState = (outputNdx == numOutputs-1) ? (state.fragOps) : (noStencilDepthWriteState);

			for (int packetNdx = 0; packetNdx < numRasterizedPackets; ++packetNdx)
			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				const FragmentPacket&	packet	= fragmentPackets[packetNdx];
				const int				xo		= fragNdx%2;
				const int				yo		= fragNdx/2;

				// Add only fragments that have live samples to shaded fragments queue.
				if (getCoverageAnyFragmentSampleLive(packet.coverage, numSamples, xo, yo))
				{
					Fragment& fragment		= fragmentBuffer[fragCount++];
					fragment.value			= fragmentOutputArray[(packetNdx*4 + fragNdx) * numOutputs + outputNdx];
				}
			}

			// Execute per-fragment ops and write
			fragProcessor.render(renderTarget.getColorBuffer((int)outputNdx), renderTarget.getDepthBuffer(), renderTarget.getStencilBuffer(), &fragmentBuffer[0], fragCount, facetype, fragOpsState);
		}
	}
}